

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_> __thiscall
Parser::parseVariableDeclaration(Parser *this)

{
  Mark *pMVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Token *__u;
  pointer this_00;
  Tokenizer *in_RSI;
  VariableDeclarationNode *in_RDI;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> value;
  Token token;
  TypeName type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  Mark mark;
  __single_object *node;
  Token *in_stack_fffffffffffffe08;
  Token *in_stack_fffffffffffffe10;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *puVar3;
  allocator<char> *in_stack_fffffffffffffe40;
  allocator<char> *__a;
  _Head_base<0UL,_VariableDeclarationNode_*,_false> this_01;
  allocator<char> *__args_1;
  uint6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  allocator<char> in_stack_fffffffffffffe6f;
  string local_190 [4];
  TokenType in_stack_fffffffffffffe74;
  Parser *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe90;
  TokenType in_stack_fffffffffffffe9c;
  Parser *in_stack_fffffffffffffea0;
  int local_158;
  Parser *in_stack_fffffffffffffeb8;
  Parser *in_stack_fffffffffffffed0;
  undefined8 local_119;
  Parser *in_stack_fffffffffffffef8;
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [88];
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  Mark local_18 [3];
  
  this_01._M_head_impl = in_RDI;
  pMVar1 = Tokenizer::getMark((Tokenizer *)0x16bf86);
  local_18[0] = *pMVar1;
  __args_1 = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             this_01._M_head_impl,(char *)in_RDI,in_stack_fffffffffffffe40);
  expectToken(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  __a = &local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             this_01._M_head_impl,(char *)in_RDI,__a);
  getToken(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
           (string *)
           CONCAT17(in_stack_fffffffffffffe6f,
                    CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
  pbVar2 = std::get<std::__cxx11::string,std::__cxx11::string,double>
                     ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)0x16c049);
  std::__cxx11::string::string(local_70,(string *)pbVar2);
  Token::~Token((Token *)0x16c06f);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             this_01._M_head_impl,(char *)in_RDI,__a);
  expectToken(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  parseType(in_stack_fffffffffffffed0);
  puVar3 = (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)&local_119;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             this_01._M_head_impl,(char *)in_RDI,__a);
  expectToken(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90);
  std::__cxx11::string::~string((string *)((long)&local_119 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  __u = Tokenizer::peek(in_RSI);
  Token::Token(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::
  unique_ptr<std::default_delete<ExpressionNode>,void>
            ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  if (local_158 == 0x30) {
    parseLambda(in_stack_fffffffffffffef8);
    std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::operator=
              (puVar3,(unique_ptr<LambdaNode,_std::default_delete<LambdaNode>_> *)__u);
    std::unique_ptr<LambdaNode,_std::default_delete<LambdaNode>_>::~unique_ptr
              ((unique_ptr<LambdaNode,_std::default_delete<LambdaNode>_> *)puVar3);
  }
  else {
    parseLogicalExpression(in_stack_fffffffffffffeb8);
    std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::operator=
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               in_stack_fffffffffffffe10,
               (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               in_stack_fffffffffffffe08);
    std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::~unique_ptr
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               in_stack_fffffffffffffe10);
  }
  puVar3 = (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
           &stack0xfffffffffffffe6f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             this_01._M_head_impl,(char *)in_RDI,__a);
  expectToken(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe6f);
  std::
  make_unique<VariableDeclarationNode,std::__cxx11::string_const&,TypeName_const&,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe6f,(uint7)in_stack_fffffffffffffe68),
             (TypeName *)__args_1,
             (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)in_RSI);
  this_00 = std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>
            ::operator->((unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>
                          *)0x16c416);
  Node::setMark((Node *)this_00,local_18);
  std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::~unique_ptr(puVar3);
  Token::~Token((Token *)0x16c4ba);
  std::__cxx11::string::~string(local_70);
  return (__uniq_ptr_data<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>,_true,_true>
          )(tuple<VariableDeclarationNode_*,_std::default_delete<VariableDeclarationNode>_>)
           this_01._M_head_impl;
}

Assistant:

std::unique_ptr<VariableDeclarationNode> Parser::parseVariableDeclaration()
{
  const auto mark = tokenizer_.getMark();
  expectToken(TokenType::KeywordLet, "Expected variable declaration!");
  const auto name = std::get<std::string>(getToken(TokenType::Identifier, "Expected variable name!").value);
  expectToken(TokenType::Colon, "Expected colon!");
  const auto type = parseType();
  expectToken(TokenType::Assign, "Expected assigment operator!");

  const auto token = tokenizer_.peek();
  std::unique_ptr<ExpressionNode> value = nullptr;
  if(token.type == TokenType::Backslash)
    value = parseLambda();
  else
    value = parseLogicalExpression();

  expectToken(TokenType::Semicolon, "Expected semicolon!");
  auto node = std::make_unique<VariableDeclarationNode>(name, type, std::move(value));
  node->setMark(mark);
  return node;
}